

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::AsmJsByteCodeWriter::AsmSimdTypedArr
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  Data *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint8 dataWidth_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint32 local_56;
  RegSlot local_52;
  undefined1 local_4e;
  undefined1 local_4d;
  uint32 local_4c;
  undefined8 local_48;
  ByteCodeWriter *local_40;
  RegSlot local_34;
  
  local_48 = CONCAT71(in_register_00000081,dataWidth);
  if (0xc < (byte)(dataWidth - 4)) {
    AssertCount = AssertCount + 1;
    local_34 = value;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x26e,"(dataWidth >= 4 && dataWidth <= 16)",
                                "dataWidth >= 4 && dataWidth <= 16");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    value = local_34;
  }
  dataWidth_00 = (uint8)local_48;
  local_34 = (RegSlot)CONCAT71(in_register_00000089,viewType);
  local_40 = &this->super_ByteCodeWriter;
  bVar2 = TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,value,slotIndex,dataWidth_00,viewType,offset);
  if (!bVar2) {
    bVar2 = TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      ((AsmJsByteCodeWriter *)local_40,op,value,slotIndex,dataWidth_00,viewType,
                       offset);
    if (!bVar2) {
      local_4e = (undefined1)local_34;
      local_4d = (undefined1)local_48;
      local_4c = offset;
      this_00 = &local_40->m_byteCodeData;
      local_56 = slotIndex;
      local_52 = value;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,local_40,false);
      ByteCodeWriter::Data::Write(this_00,&local_56,0xe);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        Assert(dataWidth >= 4 && dataWidth <= 16);
        MULTISIZE_LAYOUT_WRITE(AsmSimdTypedArr, op, value, slotIndex, dataWidth, viewType, offset);
    }